

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase61::run(TestCase61 *this)

{
  Disposer *disposerCopy;
  long *pointer;
  long *pointer_00;
  Nested *ptrCopy_1;
  char *this_00;
  Nested *ptrCopy;
  bool destroyed2;
  bool destroyed1;
  bool _kjCondition_2;
  DebugExpression<bool> _kjCondition_1;
  DebugExpression<bool_&> _kjCondition;
  byte local_24;
  bool local_23;
  bool local_22;
  DebugExpression<bool> local_21;
  DebugExpression<bool_&> local_20;
  
  local_23 = false;
  local_24 = 0;
  pointer = (long *)operator_new(0x18);
  *pointer = (long)&local_23;
  pointer[1] = 0;
  pointer[2] = 0;
  this_00 = (char *)0x18;
  pointer_00 = (long *)operator_new(0x18);
  *pointer_00 = (long)&local_24;
  pointer_00[1] = 0;
  pointer_00[2] = 0;
  pointer[1] = (long)&_::HeapDisposer<kj::(anonymous_namespace)::Nested>::instance;
  pointer[2] = 0;
  _::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
            ((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00,pointer);
  local_20.value = &local_23;
  if (_::Debug::minSeverity < 3 && local_23 == false) {
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
    ;
    _::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x43,ERROR,"\"failed: expected \" \"destroyed1\", _kjCondition",
               (char (*) [28])"failed: expected destroyed1",&local_20);
  }
  local_21.value = (bool)(local_24 ^ 1);
  if ((local_24 != 0) && (_::Debug::minSeverity < 3)) {
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
    ;
    _::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x44,ERROR,"\"failed: expected \" \"!(destroyed2)\", _kjCondition",
               (char (*) [31])"failed: expected !(destroyed2)",&local_21);
  }
  _::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
            ((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00,pointer_00);
  local_22 = (bool)(local_24 & local_23);
  if ((local_22 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x46,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\", _kjCondition",
               (char (*) [42])"failed: expected destroyed1 && destroyed2",&local_22);
  }
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}